

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O1

int __thiscall
cppcms::applications_pool::mount
          (applications_pool *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,
          void *__data)

{
  size_t *psVar1;
  _data *this_00;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  legacy_sync_pool *this_01;
  _Node *p_Var3;
  pointer *__ptr;
  shared_ptr<cppcms::application_specific_pool> p;
  unique_lock<std::recursive_mutex> lock;
  __uniq_ptr_impl<cppcms::applications_pool::factory,_std::default_delete<cppcms::applications_pool::factory>_>
  local_98;
  legacy_sync_pool *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  shared_ptr<cppcms::application_specific_pool> local_80;
  unique_lock<std::recursive_mutex> local_70;
  attachment local_60;
  
  this_01 = (legacy_sync_pool *)operator_new(0x28);
  local_98._M_t.
  super__Tuple_impl<0UL,_cppcms::applications_pool::factory_*,_std::default_delete<cppcms::applications_pool::factory>_>
  .super__Head_base<0UL,_cppcms::applications_pool::factory_*,_false>._M_head_impl =
       *(tuple<cppcms::applications_pool::factory_*,_std::default_delete<cppcms::applications_pool::factory>_>
         *)__special_file;
  __special_file[0] = '\0';
  __special_file[1] = '\0';
  __special_file[2] = '\0';
  __special_file[3] = '\0';
  __special_file[4] = '\0';
  __special_file[5] = '\0';
  __special_file[6] = '\0';
  __special_file[7] = '\0';
  impl::legacy_sync_pool::legacy_sync_pool
            (this_01,(unique_ptr<cppcms::applications_pool::factory,_std::default_delete<cppcms::applications_pool::factory>_>
                      *)&local_98);
  local_90 = this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cppcms::impl::legacy_sync_pool*>
            (&local_88,this_01);
  std::__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<cppcms::impl::legacy_sync_pool,cppcms::impl::legacy_sync_pool>
            ((__shared_ptr<cppcms::application_specific_pool,(__gnu_cxx::_Lock_policy)2> *)&local_90
             ,this_01);
  if (local_98._M_t.
      super__Tuple_impl<0UL,_cppcms::applications_pool::factory_*,_std::default_delete<cppcms::applications_pool::factory>_>
      .super__Head_base<0UL,_cppcms::applications_pool::factory_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_cppcms::applications_pool::factory_*,_std::default_delete<cppcms::applications_pool::factory>_>
       )0x0) {
    (**(code **)(*(long *)local_98._M_t.
                          super__Tuple_impl<0UL,_cppcms::applications_pool::factory_*,_std::default_delete<cppcms::applications_pool::factory>_>
                          .super__Head_base<0UL,_cppcms::applications_pool::factory_*,_false>.
                          _M_head_impl + 0x10))();
  }
  local_98._M_t.
  super__Tuple_impl<0UL,_cppcms::applications_pool::factory_*,_std::default_delete<cppcms::applications_pool::factory>_>
  .super__Head_base<0UL,_cppcms::applications_pool::factory_*,_false>._M_head_impl =
       (tuple<cppcms::applications_pool::factory_*,_std::default_delete<cppcms::applications_pool::factory>_>
        )(_Tuple_impl<0UL,_cppcms::applications_pool::factory_*,_std::default_delete<cppcms::applications_pool::factory>_>
          )0x0;
  ((local_90->super_application_specific_pool).d.ptr_)->size = (long)((this->d).ptr_)->thread_count;
  application_specific_pool::flags(&local_90->super_application_specific_pool,0x8000);
  local_70._M_device = &((this->d).ptr_)->lock;
  local_70._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_70);
  local_70._M_owns = true;
  this_00 = (this->d).ptr_;
  local_80.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = &local_90->super_application_specific_pool;
  local_80.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_88._M_pi;
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
    }
  }
  _data::attachment::attachment(&local_60,&local_80,(mount_point *)__dir);
  p_Var3 = std::__cxx11::
           list<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
           ::_M_create_node<cppcms::applications_pool::_data::attachment>(&this_00->apps,&local_60);
  std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
  psVar1 = &(this_00->apps).
            super__List_base<cppcms::applications_pool::_data::attachment,_std::allocator<cppcms::applications_pool::_data::attachment>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_60.pool.
      super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.pool.
               super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  mount_point::~mount_point(&local_60.mp);
  if (local_80.super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.
               super___shared_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_70);
  iVar2 = extraout_EAX;
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
    iVar2 = extraout_EAX_00;
  }
  return iVar2;
}

Assistant:

void applications_pool::mount(std::unique_ptr<factory> aps,mount_point const &mp)
{
	booster::shared_ptr<application_specific_pool> p(new impl::legacy_sync_pool(std::move(aps)));
	p->size(d->thread_count);
	p->flags(app::legacy);

	booster::unique_lock<booster::recursive_mutex> lock(d->lock);
	d->apps.push_back(_data::attachment(p,mp));
}